

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O2

int Dch_ClassesRefine(Dch_Cla_t *p)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = 0;
  for (lVar3 = 0; lVar3 < p->pAig->vObjs->nSize; lVar3 = lVar3 + 1) {
    if (p->pId2Class[lVar3] != (Aig_Obj_t **)0x0) {
      iVar1 = Dch_ClassesRefineOneClass(p,*p->pId2Class[lVar3],0);
      iVar2 = iVar2 + iVar1;
    }
  }
  return iVar2;
}

Assistant:

int Dch_ClassesRefine( Dch_Cla_t * p )
{
    Aig_Obj_t ** ppClass;
    int i, nRefis = 0;
    Dch_ManForEachClass( p, ppClass, i )
        nRefis += Dch_ClassesRefineOneClass( p, ppClass[0], 0 );
    return nRefis;
}